

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaL_argerror(lua_State *L,int narg,char *extramsg)

{
  int iVar1;
  undefined1 local_a0 [8];
  lua_Debug ar;
  char *extramsg_local;
  int narg_local;
  lua_State *L_local;
  
  ar._112_8_ = extramsg;
  iVar1 = lua_getstack(L,0,(lua_Debug *)local_a0);
  if (iVar1 == 0) {
    L_local._4_4_ = luaL_error(L,"bad argument #%d (%s)",(ulong)(uint)narg,ar._112_8_);
  }
  else {
    lua_getinfo(L,"n",(lua_Debug *)local_a0);
    iVar1 = strcmp(ar.name,"method");
    extramsg_local._4_4_ = narg;
    if ((iVar1 == 0) && (extramsg_local._4_4_ = narg - 1, extramsg_local._4_4_ == 0)) {
      L_local._4_4_ = luaL_error(L,"calling \'%s\' on bad self (%s)",ar._0_8_,ar._112_8_);
    }
    else {
      if (ar._0_8_ == 0) {
        ar._0_8_ = anon_var_dwarf_1278;
      }
      L_local._4_4_ =
           luaL_error(L,"bad argument #%d to \'%s\' (%s)",(ulong)extramsg_local._4_4_,ar._0_8_,
                      ar._112_8_);
    }
  }
  return L_local._4_4_;
}

Assistant:

static int luaL_argerror(lua_State*L,int narg,const char*extramsg){
lua_Debug ar;
if(!lua_getstack(L,0,&ar))
return luaL_error(L,"bad argument #%d (%s)",narg,extramsg);
lua_getinfo(L,"n",&ar);
if(strcmp(ar.namewhat,"method")==0){
narg--;
if(narg==0)
return luaL_error(L,"calling "LUA_QL("%s")" on bad self (%s)",
ar.name,extramsg);
}
if(ar.name==NULL)
ar.name="?";
return luaL_error(L,"bad argument #%d to "LUA_QL("%s")" (%s)",
narg,ar.name,extramsg);
}